

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase34::run(TestCase34 *this)

{
  bool bVar1;
  uint64_t uVar2;
  Reader local_530;
  Reader local_500;
  Reader local_4d0;
  uint local_49c;
  uint local_498;
  bool local_491;
  undefined1 local_490 [7];
  bool _kj_shouldLog_8;
  Reader local_460;
  Reader local_430;
  uint local_3fc;
  uint local_3f8;
  DebugExpression<unsigned_int> local_3f4;
  undefined1 local_3f0 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_8;
  Schema struct16Schema;
  Schema SStack_3c0;
  bool _kj_shouldLog_7;
  Schema local_3b8;
  undefined1 local_3b0 [8];
  DebugComparison<capnp::Schema,_capnp::Schema_&> _kjCondition_7;
  Schema SStack_380;
  bool _kj_shouldLog_6;
  Schema local_378;
  undefined1 local_370 [8];
  DebugComparison<capnp::Schema,_capnp::Schema_&> _kjCondition_6;
  Schema SStack_340;
  bool _kj_shouldLog_5;
  Schema local_338;
  undefined1 local_330 [8];
  DebugComparison<capnp::Schema,_capnp::Schema_&> _kjCondition_5;
  Schema SStack_300;
  bool _kj_shouldLog_4;
  bool local_2f3;
  DebugExpression<bool> local_2f2;
  bool local_2f1;
  DebugExpression<bool> _kjCondition_4;
  Schema SStack_2f0;
  bool _kj_shouldLog_3;
  bool local_2e3;
  DebugExpression<bool> local_2e2;
  bool local_2e1;
  DebugExpression<bool> _kjCondition_3;
  Schema SStack_2e0;
  bool _kj_shouldLog_2;
  bool local_2d5;
  DebugExpression<bool> local_2d4;
  bool local_2d3;
  bool local_2d2;
  DebugExpression<bool> local_2d1;
  undefined1 local_2d0 [4];
  DebugExpression<bool> _kjCondition_2;
  bool _kj_shouldLog_1;
  DebugExpression<bool> _kjCondition_1;
  String local_2a0;
  Reader local_288;
  String local_258;
  bool local_239;
  undefined1 local_238 [7];
  bool _kj_shouldLog;
  String local_208;
  Reader local_1f0;
  String local_1c0;
  DebugExpression<kj::String> local_1a8;
  undefined1 local_190 [8];
  DebugComparison<kj::String,_kj::String> _kjCondition;
  Reader local_140;
  Schema local_110;
  Schema structPSchema;
  Reader local_100;
  Schema local_d0;
  Schema struct8Schema;
  Schema local_98;
  Schema testListsSchema;
  SchemaType<capnproto_test::capnp::test::TestLists> nativeSchema;
  Schema local_78;
  Reader local_70;
  Schema local_40;
  Schema struct32Schema;
  SchemaLoader loader;
  TestCase34 *this_local;
  
  SchemaLoader::SchemaLoader((SchemaLoader *)&struct32Schema);
  local_78.raw = (RawBrandedSchema *)
                 Schema::from<capnproto_test::capnp::test::TestLists::Struct32>();
  Schema::getProto(&local_70,&local_78);
  local_40 = SchemaLoader::load((SchemaLoader *)&struct32Schema,&local_70);
  testListsSchema.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestLists>();
  Schema::getProto((Reader *)&struct8Schema,&testListsSchema);
  local_98 = SchemaLoader::load((SchemaLoader *)&struct32Schema,(Reader *)&struct8Schema);
  structPSchema.raw =
       (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestLists::Struct8>();
  Schema::getProto(&local_100,&structPSchema);
  local_d0 = SchemaLoader::load((SchemaLoader *)&struct32Schema,&local_100);
  _kjCondition._64_8_ = Schema::from<capnproto_test::capnp::test::TestLists::StructP>();
  Schema::getProto(&local_140,(Schema *)&_kjCondition.result);
  local_110 = SchemaLoader::load((SchemaLoader *)&struct32Schema,&local_140);
  Schema::getProto(&local_1f0,&testListsSchema);
  kj::str<capnp::schema::Node::Reader>(&local_1c0,&local_1f0);
  kj::_::DebugExpressionStart::operator<<
            (&local_1a8,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1c0);
  Schema::getProto((Reader *)local_238,&local_98);
  kj::str<capnp::schema::Node::Reader>(&local_208,(Reader *)local_238);
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_kj::String> *)local_190,&local_1a8,&local_208);
  kj::String::~String(&local_208);
  kj::_::DebugExpression<kj::String>::~DebugExpression(&local_1a8);
  kj::String::~String(&local_1c0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_190);
  if (!bVar1) {
    local_239 = kj::_::Debug::shouldLog(ERROR);
    while (local_239 != false) {
      Schema::getProto(&local_288,&testListsSchema);
      kj::str<capnp::schema::Node::Reader>(&local_258,&local_288);
      Schema::getProto((Reader *)local_2d0,&local_98);
      kj::str<capnp::schema::Node::Reader>(&local_2a0,(Reader *)local_2d0);
      kj::_::Debug::
      log<char_const(&)[93],kj::_::DebugComparison<kj::String,kj::String>&,kj::String,kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x2d,ERROR,
                 "\"failed: expected \" \"(kj::str(nativeSchema.getProto())) == (kj::str(testListsSchema.getProto()))\", _kjCondition, kj::str(nativeSchema.getProto()), kj::str(testListsSchema.getProto())"
                 ,(char (*) [93])
                  "failed: expected (kj::str(nativeSchema.getProto())) == (kj::str(testListsSchema.getProto()))"
                 ,(DebugComparison<kj::String,_kj::String> *)local_190,&local_258,&local_2a0);
      kj::String::~String(&local_2a0);
      kj::String::~String(&local_258);
      local_239 = false;
    }
  }
  kj::_::DebugComparison<kj::String,_kj::String>::~DebugComparison
            ((DebugComparison<kj::String,_kj::String> *)local_190);
  bVar1 = Schema::operator==(&local_98,&testListsSchema);
  local_2d2 = (bool)(~bVar1 & 1);
  local_2d1 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2d2);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_2d1);
  if (!bVar1) {
    local_2d3 = kj::_::Debug::shouldLog(ERROR);
    while (local_2d3 != false) {
      kj::_::Debug::log<char_const(&)[52],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x2f,ERROR,
                 "\"failed: expected \" \"!(testListsSchema == nativeSchema)\", _kjCondition",
                 (char (*) [52])"failed: expected !(testListsSchema == nativeSchema)",&local_2d1);
      local_2d3 = false;
    }
  }
  SStack_2e0.raw =
       (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestLists::Struct32>();
  bVar1 = Schema::operator==(&local_40,&stack0xfffffffffffffd20);
  local_2d5 = (bool)(~bVar1 & 1);
  local_2d4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2d5);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_2d4);
  if (!bVar1) {
    local_2e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2e1 != false) {
      kj::_::Debug::log<char_const(&)[80],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x30,ERROR,
                 "\"failed: expected \" \"!(struct32Schema == Schema::from<test::TestLists::Struct32>())\", _kjCondition"
                 ,(char (*) [80])
                  "failed: expected !(struct32Schema == Schema::from<test::TestLists::Struct32>())",
                 &local_2d4);
      local_2e1 = false;
    }
  }
  SStack_2f0.raw =
       (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestLists::Struct8>();
  bVar1 = Schema::operator==(&local_d0,&stack0xfffffffffffffd10);
  local_2e3 = (bool)(~bVar1 & 1);
  local_2e2 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2e3);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_2e2);
  if (!bVar1) {
    local_2f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2f1 != false) {
      kj::_::Debug::log<char_const(&)[78],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x31,ERROR,
                 "\"failed: expected \" \"!(struct8Schema == Schema::from<test::TestLists::Struct8>())\", _kjCondition"
                 ,(char (*) [78])
                  "failed: expected !(struct8Schema == Schema::from<test::TestLists::Struct8>())",
                 &local_2e2);
      local_2f1 = false;
    }
  }
  SStack_300.raw =
       (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestLists::StructP>();
  bVar1 = Schema::operator==(&local_110,&stack0xfffffffffffffd00);
  local_2f3 = (bool)(~bVar1 & 1);
  local_2f2 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2f3);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_2f2);
  if (!bVar1) {
    _kjCondition_5._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_5._39_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[78],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x32,ERROR,
                 "\"failed: expected \" \"!(structPSchema == Schema::from<test::TestLists::StructP>())\", _kjCondition"
                 ,(char (*) [78])
                  "failed: expected !(structPSchema == Schema::from<test::TestLists::StructP>())",
                 &local_2f2);
      _kjCondition_5._39_1_ = 0;
    }
  }
  uVar2 = typeId<capnproto_test::capnp::test::TestLists::Struct32,capnproto_test::capnp::test::TestLists::Struct32::_capnpPrivate>
                    ();
  SStack_340 = Schema::getDependency(&local_98,uVar2);
  local_338.raw =
       (RawBrandedSchema *)
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffcc0);
  kj::_::DebugExpression<capnp::Schema>::operator==
            ((DebugComparison<capnp::Schema,_capnp::Schema_&> *)local_330,
             (DebugExpression<capnp::Schema> *)&local_338,&local_40);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_330);
  if (!bVar1) {
    _kjCondition_6._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_6._39_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[102],kj::_::DebugComparison<capnp::Schema,capnp::Schema&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x34,ERROR,
                 "\"failed: expected \" \"testListsSchema.getDependency(typeId<test::TestLists::Struct32>()) == struct32Schema\", _kjCondition"
                 ,(char (*) [102])
                  "failed: expected testListsSchema.getDependency(typeId<test::TestLists::Struct32>()) == struct32Schema"
                 ,(DebugComparison<capnp::Schema,_capnp::Schema_&> *)local_330);
      _kjCondition_6._39_1_ = 0;
    }
  }
  uVar2 = typeId<capnproto_test::capnp::test::TestLists::Struct8,capnproto_test::capnp::test::TestLists::Struct8::_capnpPrivate>
                    ();
  SStack_380 = Schema::getDependency(&local_98,uVar2);
  local_378.raw =
       (RawBrandedSchema *)
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffc80);
  kj::_::DebugExpression<capnp::Schema>::operator==
            ((DebugComparison<capnp::Schema,_capnp::Schema_&> *)local_370,
             (DebugExpression<capnp::Schema> *)&local_378,&local_d0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_370);
  if (!bVar1) {
    _kjCondition_7._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_7._39_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[100],kj::_::DebugComparison<capnp::Schema,capnp::Schema&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x35,ERROR,
                 "\"failed: expected \" \"testListsSchema.getDependency(typeId<test::TestLists::Struct8>()) == struct8Schema\", _kjCondition"
                 ,(char (*) [100])
                  "failed: expected testListsSchema.getDependency(typeId<test::TestLists::Struct8>()) == struct8Schema"
                 ,(DebugComparison<capnp::Schema,_capnp::Schema_&> *)local_370);
      _kjCondition_7._39_1_ = 0;
    }
  }
  uVar2 = typeId<capnproto_test::capnp::test::TestLists::StructP,capnproto_test::capnp::test::TestLists::StructP::_capnpPrivate>
                    ();
  SStack_3c0 = Schema::getDependency(&local_98,uVar2);
  local_3b8.raw =
       (RawBrandedSchema *)
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffc40);
  kj::_::DebugExpression<capnp::Schema>::operator==
            ((DebugComparison<capnp::Schema,_capnp::Schema_&> *)local_3b0,
             (DebugExpression<capnp::Schema> *)&local_3b8,&local_110);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3b0);
  if (!bVar1) {
    struct16Schema.raw._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (struct16Schema.raw._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[100],kj::_::DebugComparison<capnp::Schema,capnp::Schema&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x36,ERROR,
                 "\"failed: expected \" \"testListsSchema.getDependency(typeId<test::TestLists::StructP>()) == structPSchema\", _kjCondition"
                 ,(char (*) [100])
                  "failed: expected testListsSchema.getDependency(typeId<test::TestLists::StructP>()) == structPSchema"
                 ,(DebugComparison<capnp::Schema,_capnp::Schema_&> *)local_3b0);
      struct16Schema.raw._7_1_ = false;
    }
  }
  uVar2 = typeId<capnproto_test::capnp::test::TestLists::Struct16,capnproto_test::capnp::test::TestLists::Struct16::_capnpPrivate>
                    ();
  _kjCondition_8._24_8_ = Schema::getDependency(&local_98,uVar2);
  local_3f8 = 0;
  local_3f4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3f8);
  Schema::getProto((Reader *)local_490,(Schema *)&_kjCondition_8.result);
  capnp::schema::Node::Reader::getStruct(&local_460,(Reader *)local_490);
  capnp::schema::Node::Struct::Reader::getFields(&local_430,&local_460);
  local_3fc = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size(&local_430);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_3f0,&local_3f4,&local_3fc);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3f0);
  if (!bVar1) {
    local_491 = kj::_::Debug::shouldLog(ERROR);
    while (local_491 != false) {
      local_498 = 0;
      Schema::getProto(&local_530,(Schema *)&_kjCondition_8.result);
      capnp::schema::Node::Reader::getStruct(&local_500,&local_530);
      capnp::schema::Node::Struct::Reader::getFields(&local_4d0,&local_500);
      local_49c = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size(&local_4d0);
      kj::_::Debug::
      log<char_const(&)[84],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x39,ERROR,
                 "\"failed: expected \" \"(0u) == (struct16Schema.getProto().getStruct().getFields().size())\", _kjCondition, 0u, struct16Schema.getProto().getStruct().getFields().size()"
                 ,(char (*) [84])
                  "failed: expected (0u) == (struct16Schema.getProto().getStruct().getFields().size())"
                 ,(DebugComparison<unsigned_int,_unsigned_int> *)local_3f0,&local_498,&local_49c);
      local_491 = false;
    }
  }
  SchemaLoader::~SchemaLoader((SchemaLoader *)&struct32Schema);
  return;
}

Assistant:

TEST(SchemaLoader, Load) {
  SchemaLoader loader;

  Schema struct32Schema = loader.load(Schema::from<test::TestLists::Struct32>().getProto());

  auto nativeSchema = Schema::from<test::TestLists>();
  Schema testListsSchema = loader.load(nativeSchema.getProto());

  Schema struct8Schema = loader.load(Schema::from<test::TestLists::Struct8>().getProto());
  Schema structPSchema = loader.load(Schema::from<test::TestLists::StructP>().getProto());

  EXPECT_EQ(kj::str(nativeSchema.getProto()), kj::str(testListsSchema.getProto()));

  EXPECT_FALSE(testListsSchema == nativeSchema);
  EXPECT_FALSE(struct32Schema == Schema::from<test::TestLists::Struct32>());
  EXPECT_FALSE(struct8Schema == Schema::from<test::TestLists::Struct8>());
  EXPECT_FALSE(structPSchema == Schema::from<test::TestLists::StructP>());

  EXPECT_TRUE(testListsSchema.getDependency(typeId<test::TestLists::Struct32>()) == struct32Schema);
  EXPECT_TRUE(testListsSchema.getDependency(typeId<test::TestLists::Struct8>()) == struct8Schema);
  EXPECT_TRUE(testListsSchema.getDependency(typeId<test::TestLists::StructP>()) == structPSchema);

  auto struct16Schema = testListsSchema.getDependency(typeId<test::TestLists::Struct16>());
  EXPECT_EQ(0u, struct16Schema.getProto().getStruct().getFields().size());
}